

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

int64 google::protobuf::operator/(Duration *d1,Duration *d2)

{
  uint64 uVar1;
  uint128 uVar2;
  undefined1 auStack_58 [8];
  uint128 value1;
  uint128 value2;
  bool negative1;
  bool negative2;
  
  auStack_58 = (undefined1  [8])0x0;
  value1.lo_ = 0;
  value1.hi_ = 0;
  value2.lo_ = 0;
  anon_unknown_25::ToUint128(d1,(uint128 *)auStack_58,(bool *)((long)&value2.hi_ + 6));
  anon_unknown_25::ToUint128(d2,(uint128 *)&value1.hi_,(bool *)((long)&value2.hi_ + 7));
  uVar2 = operator/((uint128 *)auStack_58,(uint128 *)&value1.hi_);
  uVar1 = uVar2.lo_;
  if (value2.hi_._6_1_ != value2.hi_._7_1_) {
    uVar1 = -uVar2.lo_;
  }
  return uVar1;
}

Assistant:

int64 operator/(const Duration& d1, const Duration& d2) {
  bool negative1, negative2;
  uint128 value1, value2;
  ToUint128(d1, &value1, &negative1);
  ToUint128(d2, &value2, &negative2);
  int64 result = Uint128Low64(value1 / value2);
  if (negative1 != negative2) {
    result = -result;
  }
  return result;
}